

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

String * kj::_::generateExtensionResponse
                   (String *__return_storage_ptr__,CompressionParameters *parameters)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [29];
  char (*pacVar3) [29];
  char (*in_RDX) [19];
  ArrayDisposer *pAVar4;
  char (*in_R8) [29];
  bool bVar5;
  unsigned_long w;
  String local_48;
  String local_30;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_18;
  
  str<char_const(&)[19]>(&local_48,(kj *)0x4d6578,in_RDX);
  if (parameters->inboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>(&local_30,(kj *)&local_48,(String *)0x4d6c5c,in_RCX);
    pacVar3 = (char (*) [29])local_48.content.size_;
    pcVar1 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      in_R8 = pacVar3;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_RCX = pacVar3;
    }
    local_48.content.ptr = local_30.content.ptr;
    local_48.content.size_ = local_30.content.size_;
    local_48.content.disposer = local_30.content.disposer;
  }
  if (parameters->outboundNoContextTakeover == true) {
    str<kj::String&,char_const(&)[29]>(&local_30,(kj *)&local_48,(String *)0x4d5c73,in_RCX);
    pacVar3 = (char (*) [29])local_48.content.size_;
    pcVar1 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_R8 = pacVar3;
    }
    local_48.content.ptr = local_30.content.ptr;
    local_48.content.size_ = local_30.content.size_;
    local_48.content.disposer = local_30.content.disposer;
  }
  if ((parameters->inboundMaxWindowBits).ptr.isSet == true) {
    local_18 = (parameters->inboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_30,(kj *)&local_48,(String *)"; client_max_window_bits=",
               (char (*) [26])&local_18,(unsigned_long *)in_R8);
    pacVar3 = (char (*) [29])local_48.content.size_;
    pcVar1 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar1,1,pacVar3,pacVar3,0);
      in_R8 = pacVar3;
    }
    local_48.content.ptr = local_30.content.ptr;
    local_48.content.size_ = local_30.content.size_;
    local_48.content.disposer = local_30.content.disposer;
  }
  pAVar4 = local_48.content.disposer;
  if ((parameters->outboundMaxWindowBits).ptr.isSet != false) {
    local_18 = (parameters->outboundMaxWindowBits).ptr.field_1;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_30,(kj *)&local_48,(String *)"; server_max_window_bits=",
               (char (*) [26])&local_18,(unsigned_long *)in_R8);
    sVar2 = local_48.content.size_;
    pcVar1 = local_48.content.ptr;
    bVar5 = local_48.content.ptr != (char *)0x0;
    local_48.content.ptr = local_30.content.ptr;
    local_48.content.size_ = local_30.content.size_;
    pAVar4 = local_30.content.disposer;
    if (bVar5) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
      local_48.content.ptr = local_30.content.ptr;
      local_48.content.size_ = local_30.content.size_;
      pAVar4 = local_30.content.disposer;
    }
  }
  (__return_storage_ptr__->content).ptr = local_48.content.ptr;
  (__return_storage_ptr__->content).size_ = local_48.content.size_;
  (__return_storage_ptr__->content).disposer = pAVar4;
  return __return_storage_ptr__;
}

Assistant:

kj::String generateExtensionResponse(const CompressionParameters& parameters) {
  // Build the `Sec-WebSocket-Extensions` response from the agreed parameters.
  kj::String response = kj::str("permessage-deflate");
  if (parameters.inboundNoContextTakeover) {
    response = kj::str(response, "; client_no_context_takeover");
  }
  if (parameters.outboundNoContextTakeover) {
    response = kj::str(response, "; server_no_context_takeover");
  }
  if (parameters.inboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.inboundMaxWindowBits);
    response = kj::str(response, "; client_max_window_bits=", w);
  }
  if (parameters.outboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.outboundMaxWindowBits);
    response = kj::str(response, "; server_max_window_bits=", w);
  }
  return kj::mv(response);
}